

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_binary.c
# Opt level: O0

int archive_write_binary_free(archive_write *a)

{
  void *__ptr;
  cpio_conflict *cpio;
  archive_write *a_local;
  
  __ptr = a->format_data;
  free(*(void **)((long)__ptr + 0x10));
  free(__ptr);
  a->format_data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_write_binary_free(struct archive_write *a)
{
	struct cpio *cpio;

	cpio = (struct cpio *)a->format_data;
	free(cpio->ino_list);
	free(cpio);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}